

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int decompression_init(archive_read *a,enctype encoding)

{
  int iVar1;
  void *pvVar2;
  int local_34;
  char *pcStack_30;
  int r;
  char *detail;
  xar *xar;
  enctype encoding_local;
  archive_read *a_local;
  
  pvVar2 = a->format->data;
  *(enctype *)((long)pvVar2 + 0x60) = encoding;
  switch(encoding) {
  case NONE:
    break;
  case GZIP:
    if (*(int *)((long)pvVar2 + 0xd8) == 0) {
      local_34 = inflateInit_((long)pvVar2 + 0x68,"1.2.11",0x70);
    }
    else {
      local_34 = inflateReset((long)pvVar2 + 0x68);
    }
    if (local_34 != 0) {
      archive_set_error(&a->archive,-1,"Couldn\'t initialize zlib stream.");
      return -0x1e;
    }
    *(undefined4 *)((long)pvVar2 + 0xd8) = 1;
    *(undefined8 *)((long)pvVar2 + 0x78) = 0;
    *(undefined8 *)((long)pvVar2 + 0x90) = 0;
    break;
  default:
    iVar1 = *(int *)((long)pvVar2 + 0x1f8);
    if (iVar1 == 2) {
      pcStack_30 = "bzip2";
    }
    else if (iVar1 == 3) {
      pcStack_30 = "lzma";
    }
    else if (iVar1 == 4) {
      pcStack_30 = "xz";
    }
    else {
      pcStack_30 = "??";
    }
    archive_set_error(&a->archive,-1,"%s compression not supported on this platform",pcStack_30);
    return -0x19;
  case LZMA:
  case XZ:
    if (*(int *)((long)pvVar2 + 0x168) != 0) {
      lzma_end((long)pvVar2 + 0xe0);
      *(undefined4 *)((long)pvVar2 + 0x168) = 0;
    }
    if (*(int *)((long)pvVar2 + 0x1f8) == 4) {
      local_34 = lzma_stream_decoder((long)pvVar2 + 0xe0,0xffffffffffffffff,8);
    }
    else {
      local_34 = lzma_alone_decoder((long)pvVar2 + 0xe0,0xffffffffffffffff);
    }
    if (local_34 != 0) {
      if (local_34 == 5) {
        archive_set_error(&a->archive,0xc,
                          "Internal error initializing compression library: Cannot allocate memory")
        ;
      }
      else if (local_34 == 8) {
        archive_set_error(&a->archive,-1,
                          "Internal error initializing compression library: Invalid or unsupported options"
                         );
      }
      else {
        archive_set_error(&a->archive,-1,"Internal error initializing lzma library");
      }
      return -0x1e;
    }
    *(undefined4 *)((long)pvVar2 + 0x168) = 1;
    *(undefined8 *)((long)pvVar2 + 0xf0) = 0;
    *(undefined8 *)((long)pvVar2 + 0x108) = 0;
  }
  return 0;
}

Assistant:

static int
decompression_init(struct archive_read *a, enum enctype encoding)
{
	struct xar *xar;
	const char *detail;
	int r;

	xar = (struct xar *)(a->format->data);
	xar->rd_encoding = encoding;
	switch (encoding) {
	case NONE:
		break;
	case GZIP:
		if (xar->stream_valid)
			r = inflateReset(&(xar->stream));
		else
			r = inflateInit(&(xar->stream));
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Couldn't initialize zlib stream.");
			return (ARCHIVE_FATAL);
		}
		xar->stream_valid = 1;
		xar->stream.total_in = 0;
		xar->stream.total_out = 0;
		break;
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	case BZIP2:
		if (xar->bzstream_valid) {
			BZ2_bzDecompressEnd(&(xar->bzstream));
			xar->bzstream_valid = 0;
		}
		r = BZ2_bzDecompressInit(&(xar->bzstream), 0, 0);
		if (r == BZ_MEM_ERROR)
			r = BZ2_bzDecompressInit(&(xar->bzstream), 0, 1);
		if (r != BZ_OK) {
			int err = ARCHIVE_ERRNO_MISC;
			detail = NULL;
			switch (r) {
			case BZ_PARAM_ERROR:
				detail = "invalid setup parameter";
				break;
			case BZ_MEM_ERROR:
				err = ENOMEM;
				detail = "out of memory";
				break;
			case BZ_CONFIG_ERROR:
				detail = "mis-compiled library";
				break;
			}
			archive_set_error(&a->archive, err,
			    "Internal error initializing decompressor: %s",
			    detail == NULL ? "??" : detail);
			xar->bzstream_valid = 0;
			return (ARCHIVE_FATAL);
		}
		xar->bzstream_valid = 1;
		xar->bzstream.total_in_lo32 = 0;
		xar->bzstream.total_in_hi32 = 0;
		xar->bzstream.total_out_lo32 = 0;
		xar->bzstream.total_out_hi32 = 0;
		break;
#endif
#if defined(HAVE_LZMA_H) && defined(HAVE_LIBLZMA)
#if LZMA_VERSION_MAJOR >= 5
/* Effectively disable the limiter. */
#define LZMA_MEMLIMIT   UINT64_MAX
#else
/* NOTE: This needs to check memory size which running system has. */
#define LZMA_MEMLIMIT   (1U << 30)
#endif
	case XZ:
	case LZMA:
		if (xar->lzstream_valid) {
			lzma_end(&(xar->lzstream));
			xar->lzstream_valid = 0;
		}
		if (xar->entry_encoding == XZ)
			r = lzma_stream_decoder(&(xar->lzstream),
			    LZMA_MEMLIMIT,/* memlimit */
			    LZMA_CONCATENATED);
		else
			r = lzma_alone_decoder(&(xar->lzstream),
			    LZMA_MEMLIMIT);/* memlimit */
		if (r != LZMA_OK) {
			switch (r) {
			case LZMA_MEM_ERROR:
				archive_set_error(&a->archive,
				    ENOMEM,
				    "Internal error initializing "
				    "compression library: "
				    "Cannot allocate memory");
				break;
			case LZMA_OPTIONS_ERROR:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Internal error initializing "
				    "compression library: "
				    "Invalid or unsupported options");
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Internal error initializing "
				    "lzma library");
				break;
			}
			return (ARCHIVE_FATAL);
		}
		xar->lzstream_valid = 1;
		xar->lzstream.total_in = 0;
		xar->lzstream.total_out = 0;
		break;
#endif
	/*
	 * Unsupported compression.
	 */
	default:
#if !defined(HAVE_BZLIB_H) || !defined(BZ_CONFIG_ERROR)
	case BZIP2:
#endif
#if !defined(HAVE_LZMA_H) || !defined(HAVE_LIBLZMA)
	case LZMA:
	case XZ:
#endif
		switch (xar->entry_encoding) {
		case BZIP2: detail = "bzip2"; break;
		case LZMA: detail = "lzma"; break;
		case XZ: detail = "xz"; break;
		default: detail = "??"; break;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "%s compression not supported on this platform",
		    detail);
		return (ARCHIVE_FAILED);
	}
	return (ARCHIVE_OK);
}